

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::
FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::FieldGeneratorMap
          (FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *this,
          Descriptor *descriptor,Context *context)

{
  FieldDescriptor *field;
  ulong __n;
  long lVar1;
  RepeatedImmutableEnumFieldGenerator *pRVar2;
  JavaType JVar3;
  int iVar4;
  int iVar5;
  long *plVar6;
  Descriptor *pDVar7;
  RepeatedImmutableEnumFieldGenerator *this_00;
  scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *psVar8;
  int messageBitIndex;
  ulong uVar9;
  int builderBitIndex;
  long lVar10;
  long lVar11;
  
  this->descriptor_ = descriptor;
  lVar10 = (long)*(int *)(descriptor + 0x2c);
  __n = lVar10 * 8;
  uVar9 = __n + 8;
  if (0xfffffffffffffff7 < __n) {
    uVar9 = 0xffffffffffffffff;
  }
  if (lVar10 < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  plVar6 = (long *)operator_new__(uVar9);
  *plVar6 = lVar10;
  if (lVar10 != 0) {
    memset((scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *)(plVar6 + 1),0,
           __n);
  }
  (this->field_generators_).array_ =
       (scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator> *)(plVar6 + 1);
  if (0 < *(int *)(descriptor + 0x2c)) {
    lVar11 = 0;
    lVar10 = 0;
    messageBitIndex = 0;
    builderBitIndex = 0;
    do {
      lVar1 = *(long *)(descriptor + 0x30);
      field = (FieldDescriptor *)(lVar1 + lVar11);
      if (*(int *)(lVar1 + 0x4c + lVar11) == 3) {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          RepeatedImmutableStringFieldGenerator::RepeatedImmutableStringFieldGenerator
                    ((RepeatedImmutableStringFieldGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          RepeatedImmutableEnumFieldGenerator::RepeatedImmutableEnumFieldGenerator
                    (this_00,field,messageBitIndex,builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          pDVar7 = FieldDescriptor::message_type(field);
          if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x6b) == '\x01') {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x48);
            ImmutableMapFieldGenerator::ImmutableMapFieldGenerator
                      ((ImmutableMapFieldGenerator *)this_00,field,messageBitIndex,builderBitIndex,
                       context);
          }
          else if ((((context->options_).enforce_lite == false) &&
                   (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar11) + 0xa0) + 0xa8) != 3)) ||
                  (*(char *)(*(long *)(lVar1 + 0x80 + lVar11) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            RepeatedImmutableMessageFieldGenerator::RepeatedImmutableMessageFieldGenerator
                      ((RepeatedImmutableMessageFieldGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            RepeatedImmutableLazyMessageFieldGenerator::RepeatedImmutableLazyMessageFieldGenerator
                      ((RepeatedImmutableLazyMessageFieldGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          RepeatedImmutablePrimitiveFieldGenerator::RepeatedImmutablePrimitiveFieldGenerator
                    ((RepeatedImmutablePrimitiveFieldGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
      }
      else if (*(long *)(lVar1 + 0x60 + lVar11) == 0) {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableStringFieldGenerator::ImmutableStringFieldGenerator
                    ((ImmutableStringFieldGenerator *)this_00,field,messageBitIndex,builderBitIndex,
                     context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableEnumFieldGenerator::ImmutableEnumFieldGenerator
                    ((ImmutableEnumFieldGenerator *)this_00,field,messageBitIndex,builderBitIndex,
                     context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          if ((((context->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar11) + 0xa0) + 0xa8) != 3)) ||
             (*(char *)(*(long *)(lVar1 + 0x80 + lVar11) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableMessageFieldGenerator::ImmutableMessageFieldGenerator
                      ((ImmutableMessageFieldGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableLazyMessageFieldGenerator::ImmutableLazyMessageFieldGenerator
                      ((ImmutableLazyMessageFieldGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutablePrimitiveFieldGenerator::ImmutablePrimitiveFieldGenerator
                    ((ImmutablePrimitiveFieldGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
      }
      else {
        JVar3 = GetJavaType(field);
        if (JVar3 == JAVATYPE_STRING) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableStringOneofFieldGenerator::ImmutableStringOneofFieldGenerator
                    ((ImmutableStringOneofFieldGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_ENUM) {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutableEnumOneofFieldGenerator::ImmutableEnumOneofFieldGenerator
                    ((ImmutableEnumOneofFieldGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
        else if (JVar3 == JAVATYPE_MESSAGE) {
          if ((((context->options_).enforce_lite == false) &&
              (*(int *)(*(long *)(*(long *)(lVar1 + 0x30 + lVar11) + 0xa0) + 0xa8) != 3)) ||
             (*(char *)(*(long *)(lVar1 + 0x80 + lVar11) + 0x6d) != '\x01')) {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableMessageOneofFieldGenerator::ImmutableMessageOneofFieldGenerator
                      ((ImmutableMessageOneofFieldGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
          else {
            this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
            ImmutableLazyMessageOneofFieldGenerator::ImmutableLazyMessageOneofFieldGenerator
                      ((ImmutableLazyMessageOneofFieldGenerator *)this_00,field,messageBitIndex,
                       builderBitIndex,context);
          }
        }
        else {
          this_00 = (RepeatedImmutableEnumFieldGenerator *)operator_new(0x58);
          ImmutablePrimitiveOneofFieldGenerator::ImmutablePrimitiveOneofFieldGenerator
                    ((ImmutablePrimitiveOneofFieldGenerator *)this_00,field,messageBitIndex,
                     builderBitIndex,context);
        }
      }
      psVar8 = internal::
               scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ImmutableFieldGenerator>_>
               ::operator[](&this->field_generators_,lVar10);
      pRVar2 = (RepeatedImmutableEnumFieldGenerator *)psVar8->ptr_;
      if (pRVar2 != this_00) {
        if (pRVar2 != (RepeatedImmutableEnumFieldGenerator *)0x0) {
          (*(pRVar2->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[1])();
        }
        psVar8->ptr_ = &this_00->super_ImmutableFieldGenerator;
      }
      iVar4 = (*(this_00->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[2])(this_00);
      iVar5 = (*(this_00->super_ImmutableFieldGenerator)._vptr_ImmutableFieldGenerator[3])(this_00);
      messageBitIndex = messageBitIndex + iVar4;
      builderBitIndex = builderBitIndex + iVar5;
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0xa8;
    } while (lVar10 < *(int *)(descriptor + 0x2c));
  }
  return;
}

Assistant:

FieldGeneratorMap<ImmutableFieldGenerator>::FieldGeneratorMap(
    const Descriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      field_generators_(new google::protobuf::scoped_ptr<
          ImmutableFieldGenerator>[descriptor->field_count()]) {

  // Construct all the FieldGenerators and assign them bit indices for their
  // bit fields.
  int messageBitIndex = 0;
  int builderBitIndex = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    ImmutableFieldGenerator* generator = MakeImmutableGenerator(
        descriptor->field(i), messageBitIndex, builderBitIndex, context);
    field_generators_[i].reset(generator);
    messageBitIndex += generator->GetNumBitsForMessage();
    builderBitIndex += generator->GetNumBitsForBuilder();
  }
}